

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalBGValueFunctionBGCGWrapper.h
# Opt level: O0

void __thiscall LocalBGValueFunctionBGCGWrapper::Print(LocalBGValueFunctionBGCGWrapper *this)

{
  ostream *this_00;
  long *in_RDI;
  string local_28 [40];
  
  (**(code **)(*in_RDI + 0x38))();
  this_00 = std::operator<<((ostream *)&std::cout,local_28);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void Print() const { std::cout << SoftPrint() << std::endl; }